

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy_toplex_map.h
# Opt level: O0

void __thiscall
Gudhi::Lazy_toplex_map::
insert_independent_simplex<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
          (Lazy_toplex_map *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *vertex_range
          )

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  int local_3c;
  unsigned_long *local_38;
  Vertex *v;
  iterator __end0;
  iterator __begin0;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *__range2;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *vertex_range_local;
  Lazy_toplex_map *this_local;
  
  __end0 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                     (vertex_range);
  v = (Vertex *)
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                (vertex_range);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&v);
    if (!bVar1) break;
    local_38 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&__end0);
    sVar2 = std::
            unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::count(&this->gamma0_lbounds,local_38);
    if (sVar2 == 0) {
      local_3c = 1;
      std::
      unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
      ::emplace<unsigned_long_const&,int>
                ((unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                  *)this,local_38,&local_3c);
    }
    else {
      pmVar3 = std::
               unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::operator[](&this->gamma0_lbounds,local_38);
      *pmVar3 = *pmVar3 + 1;
    }
    std::_Rb_tree_const_iterator<unsigned_long>::operator++(&__end0);
  }
  this->size_lbound = this->size_lbound + 1;
  insert_simplex<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
            (this,vertex_range);
  return;
}

Assistant:

void Lazy_toplex_map::insert_independent_simplex(const Input_vertex_range &vertex_range) {
  for (const Vertex &v : vertex_range)
    if (!gamma0_lbounds.count(v))
      gamma0_lbounds.emplace(v, 1);
    else
      gamma0_lbounds[v]++;
  size_lbound++;
  insert_simplex(vertex_range);
}